

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_st.c
# Opt level: O0

err_t cmdStDo(u32 tests)

{
  uint in_EDI;
  err_t code;
  bool_t in_stack_00000060;
  u32 in_stack_fffffffffffffff0;
  err_t local_c;
  err_t local_4;
  
  local_c = 0;
  if (((((in_EDI & 0x1f) == 0) ||
       (local_c = cmdStAlgs(in_stack_fffffffffffffff0), local_4 = local_c, local_c == 0)) &&
      (((in_EDI & 0x1000000) == 0 ||
       (local_c = cmdRngStart(in_stack_00000060), local_4 = local_c, local_c == 0)))) &&
     (((in_EDI & 0x2000000) == 0 || (local_c = cmdStampSelfVal(), local_4 = local_c, local_c == 0)))
     ) {
    local_4 = local_c;
  }
  return local_4;
}

Assistant:

err_t cmdStDo(u32 tests)
{
	err_t code = ERR_OK;
	// algs?
	if (tests & CMD_ST_ALGS)
	{
		code = cmdStAlgs(tests);
		ERR_CALL_CHECK(code);
	}
	// rng?
	if (tests & CMD_ST_RNG)
	{
		code = cmdRngStart(TRUE);
		ERR_CALL_CHECK(code);
	}
	// stamp?
	if (tests & CMD_ST_STAMP)
	{
		code = cmdStampSelfVal();
		ERR_CALL_CHECK(code);
	}
	return code;
}